

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP4Reader::DoGetSync(BP4Reader *this,Variable<char> *variable,char *data)

{
  int iVar1;
  BP4Reader *this_00;
  long in_RSI;
  long in_RDI;
  ScopedTimer __var2841;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff1c;
  allocator local_a1;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string local_78 [8];
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  LogMode in_stack_ffffffffffffffa0;
  allocator local_51;
  string local_50 [64];
  long local_10;
  
  local_10 = in_RSI;
  if (DoGetSync(adios2::core::Variable<char>&,char*)::__var841 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoGetSync(adios2::core::Variable<char>&,char*)::__var841);
    if (iVar1 != 0) {
      DoGetSync::__var841 = (void *)ps_timer_create_("BP4Reader::Get");
      __cxa_guard_release(&DoGetSync(adios2::core::Variable<char>&,char*)::__var841);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"Engine",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"BP4Reader",(allocator *)&stack0xffffffffffffff87);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff60,"GetSync",&local_a1);
  this_00 = (BP4Reader *)(local_10 + 8);
  helper::Comm::Rank((Comm *)0xa207b2);
  uVar2 = *(undefined4 *)(in_RDI + 0x764);
  uVar3 = 0x69;
  helper::Log(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
              in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
              in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  GetSyncCommon<char>(this_00,(Variable<char> *)CONCAT44(in_stack_ffffffffffffff1c,uVar3),
                      (char *)CONCAT44(in_stack_ffffffffffffff14,uVar2));
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_ffffffffffffff14,uVar2));
  return;
}

Assistant:

void BP4Reader::DoClose(const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER("BP4Reader::Close");
    helper::Log("Engine", "BP4Reader", "Close", m_Name, 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);
    PerformGets();
    /* Remove all variables we created in the last step */
    RemoveCreatedVars();

    m_DataFileManager.CloseFiles();
    m_MDFileManager.CloseFiles();
    m_MDIndexFileManager.CloseFiles();
}